

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O0

void __thiscall crn::corpus_tester::add_bad_block(corpus_tester *this,image_u8 *block)

{
  uint uVar1;
  uint uVar2;
  uint total_blocks;
  uint num_blocks_y;
  uint num_blocks_x;
  image_u8 *block_local;
  corpus_tester *this_local;
  
  uVar1 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_block_width
                    (&this->m_bad_block_img,4);
  uVar2 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_block_height
                    (&this->m_bad_block_img,4);
  crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::blit
            (&this->m_bad_block_img,this->m_next_bad_block_index % uVar1 << 2,
             this->m_next_bad_block_index / uVar1 << 2,block);
  this->m_next_bad_block_index = this->m_next_bad_block_index + 1;
  if (this->m_next_bad_block_index == uVar1 * uVar2) {
    flush_bad_blocks(this);
  }
  return;
}

Assistant:

void corpus_tester::add_bad_block(image_u8& block)
    {
        uint num_blocks_x = m_bad_block_img.get_block_width(4);
        uint num_blocks_y = m_bad_block_img.get_block_height(4);
        uint total_blocks = num_blocks_x * num_blocks_y;

        m_bad_block_img.blit((m_next_bad_block_index % num_blocks_x) * 4, (m_next_bad_block_index / num_blocks_x) * 4, block);
        m_next_bad_block_index++;

        if (m_next_bad_block_index == total_blocks)
        {
            flush_bad_blocks();
        }
    }